

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O0

int run_benchmark_tcp4_pound_1000(void)

{
  int iVar1;
  
  iVar1 = pound_it(1000,"tcp",tcp_do_setup,tcp_do_connect,tcp_make_connect,(void *)0x0);
  return iVar1;
}

Assistant:

BENCHMARK_IMPL(tcp4_pound_1000) {
  return pound_it(1000,
                  "tcp",
                  tcp_do_setup,
                  tcp_do_connect,
                  tcp_make_connect,
                  NULL);
}